

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_arc.cxx
# Opt level: O1

void __thiscall
Fl_Graphics_Driver::arc(Fl_Graphics_Driver *this,double x,double y,double r,double start,double end)

{
  double dVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double local_28;
  
  dVar6 = start * 0.017453292519943295;
  dVar5 = cos(dVar6);
  local_28 = sin(dVar6);
  local_28 = local_28 * -r;
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])(SUB84(dVar5 * r + x,0));
  dVar3 = transform_dx(fl_graphics_driver,r,0.0);
  dVar4 = transform_dy(fl_graphics_driver,r,0.0);
  dVar3 = dVar3 * dVar3 + dVar4 * dVar4;
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  dVar4 = transform_dx(fl_graphics_driver,0.0,r);
  dVar1 = transform_dy(fl_graphics_driver,0.0,r);
  dVar4 = dVar4 * dVar4 + dVar1 * dVar1;
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  if (dVar3 <= dVar4) {
    dVar4 = dVar3;
  }
  dVar3 = 2.0;
  if (2.0 <= dVar4) {
    dVar3 = dVar4;
  }
  dVar3 = acos(-0.125 / dVar3 + 1.0);
  dVar6 = end * 0.017453292519943295 - dVar6;
  dVar3 = ceil(ABS(dVar6) / (dVar3 + dVar3));
  iVar2 = (int)dVar3;
  if (iVar2 != 0) {
    dVar6 = dVar6 / (double)iVar2;
    dVar3 = cos(dVar6);
    dVar6 = sin(dVar6);
    dVar5 = dVar5 * r;
    do {
      dVar4 = dVar3 * dVar5 + dVar6 * local_28;
      local_28 = local_28 * dVar3 + dVar5 * -dVar6;
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
                (SUB84(dVar4 + x,0),local_28 + y);
      iVar2 = iVar2 + -1;
      dVar5 = dVar4;
    } while (iVar2 != 0);
  }
  return;
}

Assistant:

void Fl_Graphics_Driver::arc(double x, double y, double r, double start, double end) {

  // draw start point accurately:
  
  double A = start*(M_PI/180);		// Initial angle (radians)
  double X =  r*cos(A);			// Initial displacement, (X,Y)
  double Y = -r*sin(A);			//   from center to initial point
  fl_vertex(x+X,y+Y);			// Insert initial point

  // Maximum arc length to approximate with chord with error <= 0.125
  
  double epsilon; {
    double r1 = _fl_hypot(fl_transform_dx(r,0), // Horizontal "radius"
		          fl_transform_dy(r,0));
    double r2 = _fl_hypot(fl_transform_dx(0,r), // Vertical "radius"
		          fl_transform_dy(0,r));
		      
    if (r1 > r2) r1 = r2;		// r1 = minimum "radius"
    if (r1 < 2.) r1 = 2.;		// radius for circa 9 chords/circle
    
    epsilon = 2*acos(1.0 - 0.125/r1);	// Maximum arc angle
  }
  A = end*(M_PI/180) - A;		// Displacement angle (radians)
  int i = int(ceil(fabs(A)/epsilon));	// Segments in approximation
  
  if (i) {
    epsilon = A/i;			// Arc length for equal-size steps
    double cos_e = cos(epsilon);	// Rotation coefficients
    double sin_e = sin(epsilon);
    do {
      double Xnew =  cos_e*X + sin_e*Y;
		Y = -sin_e*X + cos_e*Y;
      fl_vertex(x + (X=Xnew), y + Y);
    } while (--i);
  }
}